

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

xmlChar * xmlTextReaderConstXmlLang(xmlTextReaderPtr reader)

{
  xmlChar *name;
  xmlChar *pxVar1;
  
  if (((reader != (xmlTextReaderPtr)0x0) && (reader->node != (xmlNode *)0x0)) &&
     (name = xmlNodeGetLang(reader->node), name != (xmlChar *)0x0)) {
    pxVar1 = xmlDictLookup(reader->dict,name,-1);
    (*xmlFree)(name);
    return pxVar1;
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlTextReaderConstXmlLang(xmlTextReaderPtr reader) {
    xmlChar *tmp;
    const xmlChar *ret;

    if (reader == NULL)
	return(NULL);
    if (reader->node == NULL)
	return(NULL);
    tmp = xmlNodeGetLang(reader->node);
    if (tmp == NULL)
        return(NULL);
    ret = CONSTSTR(tmp);
    xmlFree(tmp);
    return(ret);
}